

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

bool lest::search(text *part,text *line)

{
  pointer pcVar1;
  pointer pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  
  pcVar1 = (line->_M_dataplus)._M_p;
  pcVar2 = (part->_M_dataplus)._M_p;
  _Var3 = std::
          __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>>
                    (pcVar1,pcVar1 + line->_M_string_length,pcVar2,pcVar2 + part->_M_string_length);
  return _Var3._M_current != (line->_M_dataplus)._M_p + line->_M_string_length;
}

Assistant:

inline bool search( text part, text line )
    {
        auto case_insensitive_equal = []( char a, char b )
        {
            return tolower( a ) == tolower( b );
        };

        return std::search(
            line.begin(), line.end(),
            part.begin(), part.end(), case_insensitive_equal ) != line.end();
    }